

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int yaml_parser_fetch_next_token(yaml_parser_t *parser)

{
  byte *pbVar1;
  yaml_mark_t *pyVar2;
  yaml_simple_key_t **top;
  yaml_token_t **ppyVar3;
  size_t *psVar4;
  undefined8 *puVar5;
  byte bVar6;
  yaml_char_t yVar7;
  yaml_encoding_t yVar8;
  size_t sVar9;
  size_t sVar10;
  yaml_token_t *pyVar11;
  yaml_char_t *pyVar12;
  long lVar13;
  long lVar14;
  size_t sVar15;
  size_t sVar16;
  yaml_mark_t yVar17;
  yaml_mark_t yVar18;
  yaml_mark_t yVar19;
  yaml_mark_t yVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  int iVar27;
  int iVar28;
  yaml_simple_key_t *pyVar29;
  undefined1 (*pauVar30) [16];
  char *pcVar31;
  size_t sVar32;
  byte *pbVar33;
  yaml_token_t *pyVar34;
  long *plVar35;
  ulong uVar36;
  char *pcVar37;
  byte bVar38;
  uint uVar39;
  uint uVar40;
  size_t sVar41;
  char *pcVar42;
  size_t sVar43;
  long lVar44;
  long lVar45;
  yaml_char_t **ppyVar46;
  undefined1 auVar47 [8];
  bool bVar48;
  void *ptr;
  void *ptr_00;
  byte bVar49;
  undefined1 auVar50 [16];
  long lStackY_170;
  yaml_mark_t start_mark;
  int major;
  int iStack_124;
  undefined1 (*pauStack_120) [16];
  undefined1 (*apauStack_118 [2]) [16];
  undefined1 local_108 [8];
  undefined1 (*pauStack_100) [16];
  undefined1 (*local_f8 [2]) [16];
  undefined1 local_e8 [8];
  undefined1 (*pauStack_e0) [16];
  undefined1 (*local_d8 [2]) [16];
  yaml_char_t *handle_value;
  undefined1 auStack_c0 [24];
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  size_t local_90;
  size_t sStack_88;
  size_t local_80;
  int local_6c;
  yaml_mark_t end_mark;
  undefined1 local_48 [8];
  undefined1 (*pauStack_40) [16];
  undefined1 (*local_38) [16];
  
  bVar49 = 0;
  if ((parser->unread == 0) && (iVar27 = yaml_parser_update_buffer(parser,1), iVar27 == 0)) {
    return 0;
  }
  if (parser->stream_start_produced != 0) {
    local_6c = 1;
    pyVar2 = &parser->mark;
    lVar44 = 1;
    lVar13 = 2;
    lVar14 = 3;
LAB_00194e5f:
    if ((parser->unread == 0) && (iVar27 = yaml_parser_update_buffer(parser,1), iVar27 == 0)) {
      return 0;
    }
    if (((parser->mark).column == 0) &&
       (((pbVar33 = (parser->buffer).pointer, *pbVar33 == 0xef && (pbVar33[1] == 0xbb)) &&
        (pbVar33[2] == 0xbf)))) {
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = 1;
      parser->unread = parser->unread - 1;
      bVar38 = *pbVar33;
      lVar45 = lVar44;
      if ((((char)bVar38 < '\0') && (lVar45 = lVar13, (bVar38 & 0xe0) != 0xc0)) &&
         (lVar45 = lVar14, (bVar38 & 0xf0) != 0xe0)) {
        lVar45 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar33 + lVar45;
    }
    sVar41 = parser->unread;
    do {
      if ((sVar41 == 0) && (iVar27 = yaml_parser_update_buffer(parser,1), iVar27 == 0)) {
        return 0;
      }
      pbVar33 = (parser->buffer).pointer;
      bVar38 = *pbVar33;
      uVar39 = (uint)bVar38;
      if (bVar38 != 0x20) {
        if (parser->flow_level == 0) {
          if ((bVar38 != 9) || (parser->simple_key_allowed != 0)) goto joined_r0x00194fd6;
        }
        else if (bVar38 != 9) goto joined_r0x00194fd6;
      }
      (parser->mark).index = (parser->mark).index + 1;
      psVar4 = &(parser->mark).column;
      *psVar4 = *psVar4 + 1;
      sVar41 = parser->unread - 1;
      parser->unread = sVar41;
      bVar38 = *pbVar33;
      lVar45 = lVar44;
      if ((((char)bVar38 < '\0') && (lVar45 = lVar13, (bVar38 & 0xe0) != 0xc0)) &&
         (lVar45 = lVar14, (bVar38 & 0xf0) != 0xe0)) {
        lVar45 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar33 + lVar45;
    } while( true );
  }
  parser->indent = -1;
  pyVar29 = (parser->simple_keys).top;
  if (pyVar29 == (parser->simple_keys).end) {
    top = &(parser->simple_keys).top;
    iVar27 = yaml_stack_extend(&(parser->simple_keys).start,top,&(parser->simple_keys).end);
    if (iVar27 == 0) goto LAB_0019653f;
    pyVar29 = *top;
  }
  (parser->simple_keys).top = pyVar29 + 1;
  (pyVar29->mark).index = 0;
  (pyVar29->mark).line = 0;
  pyVar29->possible = 0;
  pyVar29->required = 0;
  pyVar29->token_number = 0;
  (pyVar29->mark).column = 0;
  parser->simple_key_allowed = 1;
  parser->stream_start_produced = 1;
  handle_value._0_4_ = 0;
  handle_value._4_4_ = 0;
  auStack_c0._0_4_ = 0;
  auStack_c0._4_4_ = 0;
  auStack_c0._8_4_ = 0;
  sVar41 = (parser->mark).column;
  uStack_a4 = (undefined4)sVar41;
  uStack_a0 = (undefined4)(sVar41 >> 0x20);
  sVar41 = (parser->mark).index;
  sVar15 = (parser->mark).line;
  auStack_c0._12_4_ = (undefined4)sVar41;
  auStack_c0._16_4_ = (undefined4)(sVar41 >> 0x20);
  auStack_c0._20_4_ = (undefined4)sVar15;
  local_a8 = (undefined4)(sVar15 >> 0x20);
  sVar41 = (parser->mark).column;
  sVar15 = (parser->mark).index;
  sVar16 = (parser->mark).line;
  yVar8 = parser->encoding;
  ppyVar3 = &(parser->tokens).tail;
  pyVar34 = (parser->tokens).tail;
  if (pyVar34 != (parser->tokens).end) {
LAB_00195306:
    *ppyVar3 = pyVar34 + 1;
    *(undefined8 *)pyVar34 = 1;
    (pyVar34->data).stream_start.encoding = yVar8;
    *(ulong *)((long)&(pyVar34->data).alias.value + 4) =
         CONCAT44(handle_value._4_4_,(int)handle_value);
    *(ulong *)((long)&(pyVar34->data).scalar.length + 4) =
         CONCAT44(auStack_c0._4_4_,auStack_c0._0_4_);
    *(ulong *)((long)&pyVar34->data + 0x14) = CONCAT44(auStack_c0._12_4_,auStack_c0._8_4_);
    *(ulong *)((long)&(pyVar34->start_mark).index + 4) =
         CONCAT44(auStack_c0._20_4_,auStack_c0._16_4_);
    (pyVar34->start_mark).line = CONCAT44(local_a8,auStack_c0._20_4_);
    (pyVar34->start_mark).column = CONCAT44(uStack_a0,uStack_a4);
    (pyVar34->end_mark).index = sVar15;
    (pyVar34->end_mark).line = sVar16;
    (pyVar34->end_mark).column = sVar41;
    return 1;
  }
  iVar27 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,ppyVar3,
                             &(parser->tokens).end);
  if (iVar27 != 0) {
    pyVar34 = *ppyVar3;
    goto LAB_00195306;
  }
  goto LAB_0019653f;
joined_r0x00194fd6:
  if (bVar38 == 0x23) {
    uVar39 = 0x23;
    do {
      if ((char)uVar39 == -0x3e) {
        if (pbVar33[1] == 0x85) {
          bVar38 = 0xc2;
          goto LAB_001950f5;
        }
      }
      else if (((uVar39 != 0xe2) && (uVar39 < 0xe)) && ((0x2401U >> (uVar39 & 0x1f) & 1) != 0))
      break;
      (parser->mark).index = (parser->mark).index + 1;
      psVar4 = &(parser->mark).column;
      *psVar4 = *psVar4 + 1;
      sVar41 = parser->unread - 1;
      parser->unread = sVar41;
      bVar38 = *pbVar33;
      lVar45 = lVar44;
      if ((((char)bVar38 < '\0') && (lVar45 = lVar13, (bVar38 & 0xe0) != 0xc0)) &&
         (lVar45 = lVar14, (bVar38 & 0xf0) != 0xe0)) {
        lVar45 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
      }
      pbVar33 = pbVar33 + lVar45;
      (parser->buffer).pointer = pbVar33;
      if (sVar41 == 0) {
        iVar27 = yaml_parser_update_buffer(parser,1);
        if (iVar27 == 0) {
          return 0;
        }
        pbVar33 = (parser->buffer).pointer;
      }
      uVar39 = (uint)*pbVar33;
    } while( true );
  }
  bVar38 = (byte)uVar39;
  if (((bVar38 != 10) && (uVar39 != 0xd)) &&
     ((uVar39 == 0xe2 || ((uVar39 != 0xc2 || (bVar38 = 0xc2, pbVar33[1] != 0x85))))))
  goto LAB_00195355;
LAB_001950f5:
  if (parser->unread < 2) {
    iVar27 = yaml_parser_update_buffer(parser,2);
    if (iVar27 == 0) {
      return 0;
    }
    pbVar33 = (parser->buffer).pointer;
    bVar38 = *pbVar33;
  }
  if (bVar38 == 10) {
LAB_00195188:
    (parser->mark).column = 0;
    (parser->mark).index = (parser->mark).index + 1;
    (parser->mark).line = (parser->mark).line + 1;
    parser->unread = parser->unread - 1;
    bVar38 = *pbVar33;
    lVar45 = lVar44;
    if ((((char)bVar38 < '\0') && (lVar45 = lVar13, (bVar38 & 0xe0) != 0xc0)) &&
       (lVar45 = lVar14, (bVar38 & 0xf0) != 0xe0)) {
      lVar45 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
    }
  }
  else {
    if (bVar38 == 0xe2) goto LAB_001951f4;
    if (bVar38 == 0xc2) {
      if (pbVar33[1] != 0x85) goto LAB_001951f4;
      goto LAB_00195188;
    }
    if (bVar38 != 0xd) goto LAB_001951f4;
    if (pbVar33[1] != 10) goto LAB_00195188;
    (parser->mark).column = 0;
    (parser->mark).index = (parser->mark).index + 2;
    (parser->mark).line = (parser->mark).line + 1;
    parser->unread = parser->unread - 2;
    lVar45 = lVar13;
  }
  (parser->buffer).pointer = pbVar33 + lVar45;
LAB_001951f4:
  if (parser->flow_level == 0) {
    parser->simple_key_allowed = 1;
  }
  goto LAB_00194e5f;
LAB_00195355:
  iVar27 = yaml_parser_stale_simple_keys(parser);
  if (iVar27 == 0) {
    return 0;
  }
  iVar27 = yaml_parser_unroll_indent(parser,(parser->mark).column);
  if (iVar27 == 0) {
    return 0;
  }
  if ((parser->unread < 4) && (iVar27 = yaml_parser_update_buffer(parser,4), iVar27 == 0)) {
    return 0;
  }
  pbVar33 = (parser->buffer).pointer;
  bVar38 = *pbVar33;
  if (bVar38 == 0) {
    if ((parser->mark).column != 0) {
      (parser->mark).column = 0;
      psVar4 = &(parser->mark).line;
      *psVar4 = *psVar4 + 1;
    }
    iVar27 = yaml_parser_unroll_indent(parser,-1);
    if (iVar27 == 0) {
      return 0;
    }
    iVar27 = yaml_parser_remove_simple_key(parser);
    if (iVar27 == 0) {
      return 0;
    }
    parser->simple_key_allowed = 0;
    auStack_c0._8_4_ = 0;
    auStack_c0._12_4_ = 0;
    auStack_c0._16_4_ = YAML_ANY_SCALAR_STYLE;
    handle_value._0_4_ = 0;
    handle_value._4_4_ = 0;
    auStack_c0._0_4_ = 0;
    auStack_c0._4_4_ = 0;
    sVar41 = (parser->mark).column;
    uStack_9c = (undefined4)sVar41;
    uStack_98 = (undefined4)(sVar41 >> 0x20);
    sVar41 = (parser->mark).line;
    auStack_c0._20_4_ = (undefined4)pyVar2->index;
    local_a8 = (undefined4)(pyVar2->index >> 0x20);
    uStack_a4 = (undefined4)sVar41;
    uStack_a0 = (undefined4)(sVar41 >> 0x20);
    sVar41 = (parser->mark).column;
    sVar15 = pyVar2->index;
    sVar16 = (parser->mark).line;
    ppyVar3 = &(parser->tokens).tail;
    pyVar34 = (parser->tokens).tail;
    if (pyVar34 == (parser->tokens).end) {
      iVar27 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,ppyVar3,
                                 &(parser->tokens).end);
      if (iVar27 == 0) goto LAB_00196a23;
      pyVar34 = *ppyVar3;
    }
    *ppyVar3 = pyVar34 + 1;
    pyVar34->type = YAML_STREAM_END_TOKEN;
    *(ulong *)&pyVar34->field_0x4 = CONCAT44(handle_value._4_4_,(int)handle_value);
    *(ulong *)((long)&(pyVar34->data).alias.value + 4) = CONCAT44(auStack_c0._4_4_,auStack_c0._0_4_)
    ;
    *(ulong *)((long)&(pyVar34->data).scalar.length + 4) =
         CONCAT44(auStack_c0._12_4_,auStack_c0._8_4_);
    *(ulong *)((long)&pyVar34->data + 0x14) = CONCAT44(auStack_c0._20_4_,auStack_c0._16_4_);
    *(ulong *)((long)&(pyVar34->start_mark).index + 4) = CONCAT44(uStack_a4,local_a8);
    *(ulong *)((long)&(pyVar34->start_mark).line + 4) = CONCAT44(uStack_9c,uStack_a0);
    *(undefined4 *)((long)&(pyVar34->start_mark).column + 4) = uStack_98;
    (pyVar34->end_mark).index = sVar15;
    (pyVar34->end_mark).line = sVar16;
    end_mark.column = sVar41;
    goto LAB_00195557;
  }
  sVar41 = (parser->mark).column;
  if (bVar38 == 0x25 && sVar41 == 0) {
    iVar27 = yaml_parser_unroll_indent(parser,-1);
    if (iVar27 == 0) {
      return 0;
    }
    iVar27 = yaml_parser_remove_simple_key(parser);
    if (iVar27 == 0) {
      return 0;
    }
    parser->simple_key_allowed = 0;
    sVar15 = pyVar2->index;
    sVar16 = (parser->mark).line;
    sVar41 = (parser->mark).column;
    yVar20 = *pyVar2;
    yVar19 = *pyVar2;
    yVar18 = *pyVar2;
    yVar17 = *pyVar2;
    (parser->mark).index = (parser->mark).index + 1;
    psVar4 = &(parser->mark).column;
    *psVar4 = *psVar4 + 1;
    parser->unread = parser->unread - 1;
    pbVar33 = (parser->buffer).pointer;
    bVar38 = *pbVar33;
    if ((char)bVar38 < '\0') {
      if ((bVar38 & 0xe0) == 0xc0) {
        lStackY_170 = 2;
      }
      else if ((bVar38 & 0xf0) == 0xe0) {
        lStackY_170 = 3;
      }
      else {
        lStackY_170 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
      }
    }
    else {
      lStackY_170 = 1;
    }
    (parser->buffer).pointer = pbVar33 + lStackY_170;
    auStack_c0._0_4_ = 0;
    auStack_c0._4_4_ = 0;
    auStack_c0._8_4_ = 0;
    auStack_c0._12_4_ = 0;
    pauVar30 = (undefined1 (*) [16])yaml_malloc(0x10);
    handle_value._0_4_ = (int)pauVar30;
    handle_value._4_4_ = (int)((ulong)pauVar30 >> 0x20);
    if (pauVar30 == (undefined1 (*) [16])0x0) {
LAB_0019592e:
      parser->error = YAML_MEMORY_ERROR;
    }
    else {
      auStack_c0._0_8_ = pauVar30 + 1;
      *pauVar30 = (undefined1  [16])0x0;
      auStack_c0._8_4_ = (int)handle_value;
      auStack_c0._12_4_ = handle_value._4_4_;
      if (parser->unread == 0) {
        iVar27 = yaml_parser_update_buffer(parser,1);
        if (iVar27 == 0) goto LAB_00195934;
      }
      do {
        do {
          pbVar33 = (parser->buffer).pointer;
          bVar38 = *pbVar33;
          if ((((9 < (byte)(bVar38 - 0x30)) && (0x19 < (byte)((bVar38 & 0xdf) + 0xbf))) &&
              (bVar38 != 0x5f)) && (bVar38 != 0x2d)) {
            auVar47 = (undefined1  [8])CONCAT44(handle_value._4_4_,(int)handle_value);
            if (auVar47 == (undefined1  [8])auStack_c0._8_8_) {
              parser->error = YAML_SCANNER_ERROR;
              parser->context = "while scanning a directive";
              (parser->context_mark).index = sVar15;
              (parser->context_mark).line = sVar16;
              (parser->context_mark).column = sVar41;
              pcVar31 = "could not find expected directive name";
            }
            else {
              uVar39 = (uint)bVar38;
              if (((uVar39 < 0x21) && ((0x100002601U >> ((ulong)uVar39 & 0x3f) & 1) != 0)) ||
                 ((uVar39 != 0xe2 && ((uVar39 == 0xc2 && (pbVar33[1] == 0x85)))))) {
                iVar27 = strcmp((char *)auVar47,"YAML");
                uVar25 = uStack_94;
                uVar23 = uStack_9c;
                uVar21 = uStack_a4;
                uStack_a4 = (undefined4)(sVar15 >> 0x20);
                uVar22 = uStack_a4;
                uStack_9c = (undefined4)(sVar16 >> 0x20);
                uVar24 = uStack_9c;
                uStack_94 = (undefined4)(sVar41 >> 0x20);
                uVar26 = uStack_94;
                uStack_a4 = uVar21;
                uStack_9c = uVar23;
                uStack_94 = uVar25;
                if (iVar27 == 0) {
                  if (parser->unread == 0) {
                    iVar27 = yaml_parser_update_buffer(parser,1);
                    if (iVar27 == 0) goto LAB_00195947;
                  }
                  goto LAB_00196170;
                }
                iVar27 = strcmp((char *)auVar47,"TAG");
                if (iVar27 != 0) {
                  parser->error = YAML_SCANNER_ERROR;
                  parser->context = "while scanning a directive";
                  (parser->context_mark).index = sVar15;
                  (parser->context_mark).line = sVar16;
                  (parser->context_mark).column = sVar41;
                  pcVar31 = "found unknown directive name";
                  goto LAB_001959ed;
                }
                handle_value._0_4_ = 0;
                handle_value._4_4_ = 0;
                end_mark.index = 0;
                if (parser->unread == 0) {
                  iVar27 = yaml_parser_update_buffer(parser,1);
                  if (iVar27 == 0) goto LAB_00196ddb;
                }
                goto LAB_0019631d;
              }
              parser->error = YAML_SCANNER_ERROR;
              parser->context = "while scanning a directive";
              (parser->context_mark).index = sVar15;
              (parser->context_mark).line = sVar16;
              (parser->context_mark).column = sVar41;
              pcVar31 = "found unexpected non-alphabetical character";
            }
            parser->problem = pcVar31;
            sVar41 = (parser->mark).line;
            (parser->problem_mark).index = pyVar2->index;
            (parser->problem_mark).line = sVar41;
            (parser->problem_mark).column = (parser->mark).column;
            goto LAB_00195934;
          }
          if ((ulong)auStack_c0._0_8_ <= (ulong)(auStack_c0._8_8_ + 5)) {
            iVar27 = yaml_string_extend(&handle_value,(yaml_char_t **)(auStack_c0 + 8),
                                        (yaml_char_t **)auStack_c0);
            if (iVar27 == 0) goto LAB_0019592e;
            pbVar33 = (parser->buffer).pointer;
            bVar38 = *pbVar33;
          }
          pbVar1 = (byte *)auStack_c0._8_8_;
          if ((char)bVar38 < '\0') {
            if ((bVar38 & 0xe0) == 0xc0) {
LAB_001958b1:
              (parser->buffer).pointer = pbVar33 + 1;
              pbVar1 = (byte *)(auStack_c0._8_8_ + 1);
              *(byte *)auStack_c0._8_8_ = *pbVar33;
              pbVar33 = (parser->buffer).pointer;
              goto LAB_001958db;
            }
            if ((bVar38 & 0xf0) == 0xe0) {
LAB_00195887:
              (parser->buffer).pointer = pbVar33 + 1;
              auStack_c0._8_8_ = pbVar1 + 1;
              *pbVar1 = *pbVar33;
              pbVar33 = (parser->buffer).pointer;
              goto LAB_001958b1;
            }
            if ((bVar38 & 0xf8) == 0xf0) {
              (parser->buffer).pointer = pbVar33 + 1;
              pbVar1 = (byte *)(auStack_c0._8_8_ + 1);
              *(byte *)auStack_c0._8_8_ = *pbVar33;
              pbVar33 = (parser->buffer).pointer;
              goto LAB_00195887;
            }
          }
          else {
LAB_001958db:
            (parser->buffer).pointer = pbVar33 + 1;
            auStack_c0._8_8_ = pbVar1 + 1;
            *pbVar1 = *pbVar33;
          }
          (parser->mark).index = (parser->mark).index + 1;
          psVar4 = &(parser->mark).column;
          *psVar4 = *psVar4 + 1;
          psVar4 = &parser->unread;
          *psVar4 = *psVar4 - 1;
        } while (*psVar4 != 0);
        iVar27 = yaml_parser_update_buffer(parser,1);
      } while (iVar27 != 0);
    }
LAB_00195934:
    yaml_free((void *)CONCAT44(handle_value._4_4_,(int)handle_value));
    auVar47 = (undefined1  [8])0x0;
    goto LAB_00195947;
  }
  if (sVar41 == 0) {
    switch(bVar38 - 0x20) {
    case 0:
    case 3:
    case 5:
    case 0x20:
      goto switchD_00195582_caseD_0;
    case 1:
      goto switchD_00195582_caseD_1;
    case 2:
      goto switchD_00195582_caseD_2;
    case 4:
    case 8:
    case 9:
    case 0xb:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1b:
    case 0x1c:
    case 0x1d:
      break;
    case 6:
      goto switchD_00195582_caseD_6;
    case 7:
      goto switchD_00195582_caseD_7;
    case 10:
      goto switchD_00195582_caseD_a;
    case 0xc:
      goto switchD_00195582_caseD_c;
    case 0xd:
      bVar38 = pbVar33[1];
      if (bVar38 != 0x2d) goto LAB_00195f5d;
      if (pbVar33[2] == 0x2d) {
        bVar38 = pbVar33[3];
        if ((((ulong)bVar38 < 0x21) && ((0x100002601U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) ||
           ((bVar38 != 0xe2 && ((bVar38 == 0xc2 && (pbVar33[4] == 0x85)))))) {
          lStackY_170._0_4_ = YAML_DOCUMENT_START_TOKEN;
          goto LAB_00195f43;
        }
      }
      break;
    case 0xe:
      if ((pbVar33[1] == 0x2e) && (pbVar33[2] == 0x2e)) {
        bVar38 = pbVar33[3];
        if ((((ulong)bVar38 < 0x21) && ((0x100002601U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) ||
           (((bVar38 != 0xe2 && (bVar38 == 0xc2)) && (pbVar33[4] == 0x85)))) {
          lStackY_170._0_4_ = YAML_DOCUMENT_END_TOKEN;
LAB_00195f43:
          iVar27 = yaml_parser_fetch_document_indicator(parser,(yaml_token_type_t)lStackY_170);
          return iVar27;
        }
      }
      break;
    case 0x1a:
      goto switchD_00195582_caseD_1a;
    case 0x1e:
      goto switchD_00195582_caseD_1e;
    case 0x1f:
      goto switchD_00195582_caseD_1f;
    default:
      goto switchD_00195582_default;
    }
    goto switchD_00195582_caseD_4;
  }
  switch(bVar38 - 0x20) {
  case 0:
  case 3:
  case 5:
  case 0x20:
    break;
  case 1:
switchD_00195582_caseD_1:
    iVar27 = yaml_parser_save_simple_key(parser);
    if (iVar27 == 0) {
      return 0;
    }
    parser->simple_key_allowed = 0;
    end_mark.index = 0;
    major = 0;
    iStack_124 = 0;
    sVar41 = (parser->mark).column;
    sVar15 = pyVar2->index;
    sVar16 = (parser->mark).line;
    yVar19 = *pyVar2;
    yVar20 = *pyVar2;
    yVar18 = *pyVar2;
    yVar17 = *pyVar2;
    if ((parser->unread < 2) && (iVar27 = yaml_parser_update_buffer(parser,2), iVar27 == 0)) {
LAB_001962dd:
      pcVar31 = (char *)0x0;
    }
    else if ((parser->buffer).pointer[1] == '<') {
      pcVar31 = (char *)yaml_malloc(1);
      if (pcVar31 == (char *)0x0) goto LAB_001962dd;
      *pcVar31 = '\0';
      sVar43 = (parser->mark).index;
      (parser->mark).index = sVar43 + 1;
      sVar9 = (parser->mark).column;
      (parser->mark).column = sVar9 + 1;
      pbVar33 = (parser->buffer).pointer;
      sVar10 = parser->unread;
      parser->unread = sVar10 - 1;
      bVar38 = *pbVar33;
      lStackY_170 = 1;
      if ((char)bVar38 < '\0') {
        if ((bVar38 & 0xe0) == 0xc0) {
          lStackY_170 = 2;
        }
        else if ((bVar38 & 0xf0) == 0xe0) {
          lStackY_170 = 3;
        }
        else {
          lStackY_170 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
        }
      }
      pbVar1 = pbVar33 + lStackY_170;
      (parser->buffer).pointer = pbVar1;
      (parser->mark).index = sVar43 + 2;
      (parser->mark).column = sVar9 + 2;
      parser->unread = sVar10 - 2;
      bVar38 = pbVar33[lStackY_170];
      lStackY_170 = 1;
      if ((char)bVar38 < '\0') {
        if ((bVar38 & 0xe0) == 0xc0) {
          lStackY_170 = 2;
        }
        else if ((bVar38 & 0xf0) == 0xe0) {
          lStackY_170 = 3;
        }
        else {
          lStackY_170 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
        }
      }
      (parser->buffer).pointer = pbVar1 + lStackY_170;
      iVar27 = yaml_parser_scan_tag_uri(parser,0,(yaml_char_t *)0x0,yVar19,(yaml_char_t **)&major);
      if (iVar27 == 0) goto LAB_00197dfe;
      pbVar33 = (parser->buffer).pointer;
      if (*pbVar33 == 0x3e) {
        (parser->mark).index = (parser->mark).index + 1;
        psVar4 = &(parser->mark).column;
        *psVar4 = *psVar4 + 1;
        parser->unread = parser->unread - 1;
        bVar38 = *pbVar33;
        if ((char)bVar38 < '\0') {
          if ((bVar38 & 0xe0) == 0xc0) {
            lStackY_170 = 2;
          }
          else if ((bVar38 & 0xf0) == 0xe0) {
            lStackY_170 = 3;
          }
          else {
            lStackY_170 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
          }
        }
        else {
          lStackY_170 = 1;
        }
        (parser->buffer).pointer = pbVar33 + lStackY_170;
        goto LAB_00197c89;
      }
      pcVar37 = "did not find the expected \'>\'";
LAB_00197dc1:
      parser->error = YAML_SCANNER_ERROR;
      parser->context = "while scanning a tag";
      (parser->context_mark).index = sVar15;
      (parser->context_mark).line = sVar16;
      (parser->context_mark).column = sVar41;
      parser->problem = pcVar37;
      sVar41 = (parser->mark).line;
      (parser->problem_mark).index = pyVar2->index;
      (parser->problem_mark).line = sVar41;
      (parser->problem_mark).column = (parser->mark).column;
    }
    else {
      iVar27 = yaml_parser_scan_tag_handle(parser,0,yVar17,(yaml_char_t **)&end_mark);
      pcVar31 = (char *)end_mark.index;
      if (iVar27 != 0) {
        if (((*(char *)end_mark.index == '!') && (*(char *)(end_mark.index + 1) != '\0')) &&
           (sVar32 = strlen((char *)end_mark.index), *(char *)(((long)pcVar31 - 1U) + sVar32) == '!'
           )) {
          iVar27 = yaml_parser_scan_tag_uri
                             (parser,0,(yaml_char_t *)0x0,yVar18,(yaml_char_t **)&major);
          if (iVar27 != 0) {
LAB_00197c89:
            if ((parser->unread != 0) || (iVar27 = yaml_parser_update_buffer(parser,1), iVar27 != 0)
               ) {
              pbVar33 = (parser->buffer).pointer;
              bVar38 = *pbVar33;
              if ((((ulong)bVar38 < 0x21) && ((0x100002601U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) ||
                 (((pcVar37 = "did not find expected whitespace or line break", bVar38 != 0xe2 &&
                   (bVar38 == 0xc2)) && (pbVar33[1] == 0x85)))) {
                local_80 = (parser->mark).column;
                local_90 = pyVar2->index;
                sStack_88 = (parser->mark).line;
                handle_value._4_4_ = 0;
                auStack_c0._16_4_ = YAML_ANY_SCALAR_STYLE;
                auStack_c0._20_4_ = 0;
                handle_value._0_4_ = 0x14;
                local_a8 = (undefined4)sVar15;
                uStack_a4 = (undefined4)(sVar15 >> 0x20);
                uStack_a0 = (undefined4)sVar16;
                uStack_9c = (undefined4)(sVar16 >> 0x20);
                uStack_98 = (undefined4)sVar41;
                uStack_94 = (undefined4)(sVar41 >> 0x20);
                auStack_c0._0_4_ = SUB84(pcVar31,0);
                auStack_c0._4_4_ = (undefined4)((ulong)pcVar31 >> 0x20);
                auStack_c0._8_4_ = major;
                auStack_c0._12_4_ = iStack_124;
LAB_00197d2f:
                pyVar34 = (parser->tokens).tail;
                if (pyVar34 != (parser->tokens).end) goto LAB_00197d6e;
                iVar27 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,
                                           &(parser->tokens).tail,&(parser->tokens).end);
                if (iVar27 == 0) {
                  parser->error = YAML_MEMORY_ERROR;
                  yaml_token_delete((yaml_token_t *)&handle_value);
                  return 0;
                }
                goto LAB_00197d6b;
              }
              goto LAB_00197dc1;
            }
          }
        }
        else {
          iVar27 = yaml_parser_scan_tag_uri
                             (parser,0,(yaml_char_t *)pcVar31,yVar20,(yaml_char_t **)&major);
          if (iVar27 != 0) {
            yaml_free(pcVar31);
            pcVar31 = (char *)yaml_malloc(2);
            if (pcVar31 == (char *)0x0) goto LAB_001962dd;
            pcVar31[0] = '!';
            pcVar31[1] = '\0';
            pcVar37 = (char *)CONCAT44(iStack_124,major);
            pcVar42 = pcVar37;
            if (*pcVar37 == '\0') {
              pcVar42 = pcVar31;
            }
            major = (int)pcVar42;
            iStack_124 = (int)((ulong)pcVar42 >> 0x20);
            if (*pcVar37 == '\0') {
              pcVar31 = pcVar37;
            }
            goto LAB_00197c89;
          }
        }
      }
    }
LAB_00197dfe:
    yaml_free(pcVar31);
    auVar47 = (undefined1  [8])CONCAT44(iStack_124,major);
    goto LAB_0019595d;
  case 2:
switchD_00195582_caseD_2:
    iVar27 = 0;
LAB_00195b4b:
    iVar27 = yaml_parser_fetch_flow_scalar(parser,iVar27);
    return iVar27;
  case 4:
  case 8:
  case 9:
  case 0xb:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1b:
  case 0x1c:
  case 0x1d:
    goto switchD_00195582_caseD_4;
  case 6:
switchD_00195582_caseD_6:
    lStackY_170._0_4_ = YAML_ANCHOR_TOKEN;
LAB_00195a41:
    iVar27 = yaml_parser_fetch_anchor(parser,(yaml_token_type_t)lStackY_170);
    return iVar27;
  case 7:
switchD_00195582_caseD_7:
    iVar27 = 1;
    goto LAB_00195b4b;
  case 10:
switchD_00195582_caseD_a:
    lStackY_170._0_4_ = YAML_ALIAS_TOKEN;
    goto LAB_00195a41;
  case 0xc:
switchD_00195582_caseD_c:
    iVar27 = yaml_parser_remove_simple_key(parser);
    if (iVar27 == 0) {
      return 0;
    }
    parser->simple_key_allowed = 1;
    sVar41 = (parser->mark).column;
    sVar15 = pyVar2->index;
    sVar16 = (parser->mark).line;
    (parser->mark).index = (parser->mark).index + 1;
    psVar4 = &(parser->mark).column;
    *psVar4 = *psVar4 + 1;
    parser->unread = parser->unread - 1;
    pbVar33 = (parser->buffer).pointer;
    bVar49 = *pbVar33;
    if ((char)bVar49 < '\0') {
      if ((bVar49 & 0xe0) == 0xc0) {
        lStackY_170 = 2;
      }
      else if ((bVar49 & 0xf0) == 0xe0) {
        lStackY_170 = 3;
      }
      else {
        lStackY_170 = (ulong)((bVar49 & 0xf8) == 0xf0) << 2;
      }
    }
    else {
      lStackY_170 = 1;
    }
    (parser->buffer).pointer = pbVar33 + lStackY_170;
    end_mark.column = (parser->mark).column;
    end_mark.index = pyVar2->index;
    end_mark.line = (parser->mark).line;
    handle_value._0_4_ = 0;
    handle_value._4_4_ = 0;
    auStack_c0._0_4_ = 0;
    auStack_c0._4_4_ = 0;
    auStack_c0._8_4_ = 0;
    auStack_c0._12_4_ = 0;
    auStack_c0._16_4_ = YAML_ANY_SCALAR_STYLE;
    uStack_9c = (undefined4)sVar41;
    uStack_98 = (undefined4)(sVar41 >> 0x20);
    auStack_c0._20_4_ = (undefined4)sVar15;
    local_a8 = (undefined4)(sVar15 >> 0x20);
    uStack_a4 = (undefined4)sVar16;
    uStack_a0 = (undefined4)(sVar16 >> 0x20);
    ppyVar3 = &(parser->tokens).tail;
    pyVar34 = (parser->tokens).tail;
    if (pyVar34 == (parser->tokens).end) {
      iVar27 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,ppyVar3,
                                 &(parser->tokens).end);
      if (iVar27 == 0) {
LAB_00196a23:
        parser->error = YAML_MEMORY_ERROR;
        return 0;
      }
      pyVar34 = *ppyVar3;
    }
    *ppyVar3 = pyVar34 + 1;
    pyVar34->type = YAML_FLOW_ENTRY_TOKEN;
LAB_001969d8:
    *(ulong *)&pyVar34->field_0x4 = CONCAT44(handle_value._4_4_,(int)handle_value);
    *(ulong *)((long)&(pyVar34->data).alias.value + 4) = CONCAT44(auStack_c0._4_4_,auStack_c0._0_4_)
    ;
    *(ulong *)((long)&(pyVar34->data).scalar.length + 4) =
         CONCAT44(auStack_c0._12_4_,auStack_c0._8_4_);
    *(ulong *)((long)&pyVar34->data + 0x14) = CONCAT44(auStack_c0._20_4_,auStack_c0._16_4_);
    *(ulong *)((long)&(pyVar34->start_mark).index + 4) = CONCAT44(uStack_a4,local_a8);
    *(ulong *)((long)&(pyVar34->start_mark).line + 4) = CONCAT44(uStack_9c,uStack_a0);
    *(undefined4 *)((long)&(pyVar34->start_mark).column + 4) = uStack_98;
    (pyVar34->end_mark).index = end_mark.index;
    (pyVar34->end_mark).line = end_mark.line;
LAB_00195557:
    (pyVar34->end_mark).column = end_mark.column;
    return 1;
  case 0xd:
    bVar38 = pbVar33[1];
LAB_00195f5d:
    if (((bVar38 < 0x21) && ((0x100002601U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) ||
       ((bVar38 != 0xe2 && ((bVar38 == 0xc2 && (pbVar33[2] == 0x85)))))) {
      if (parser->flow_level == 0) {
        if (parser->simple_key_allowed == 0) {
          parser->error = YAML_SCANNER_ERROR;
          parser->context = (char *)0x0;
          sVar41 = (parser->mark).line;
          (parser->context_mark).index = pyVar2->index;
          (parser->context_mark).line = sVar41;
          (parser->context_mark).column = (parser->mark).column;
          pcVar31 = "block sequence entries are not allowed in this context";
          goto LAB_00196ac8;
        }
        iVar27 = yaml_parser_roll_indent(parser,sVar41,-1,YAML_BLOCK_SEQUENCE_START_TOKEN,*pyVar2);
        if (iVar27 == 0) {
          return 0;
        }
      }
      iVar27 = yaml_parser_remove_simple_key(parser);
      if (iVar27 == 0) {
        return 0;
      }
      parser->simple_key_allowed = 1;
      sVar41 = (parser->mark).column;
      sVar15 = pyVar2->index;
      sVar16 = (parser->mark).line;
      (parser->mark).index = (parser->mark).index + 1;
      psVar4 = &(parser->mark).column;
      *psVar4 = *psVar4 + 1;
      parser->unread = parser->unread - 1;
      pbVar33 = (parser->buffer).pointer;
      bVar49 = *pbVar33;
      if ((char)bVar49 < '\0') {
        if ((bVar49 & 0xe0) == 0xc0) {
          lStackY_170 = 2;
        }
        else if ((bVar49 & 0xf0) == 0xe0) {
          lStackY_170 = 3;
        }
        else {
          lStackY_170 = (ulong)((bVar49 & 0xf8) == 0xf0) << 2;
        }
      }
      else {
        lStackY_170 = 1;
      }
      (parser->buffer).pointer = pbVar33 + lStackY_170;
      end_mark.column = (parser->mark).column;
      end_mark.index = pyVar2->index;
      end_mark.line = (parser->mark).line;
      handle_value._0_4_ = 0;
      handle_value._4_4_ = 0;
      auStack_c0._0_4_ = 0;
      auStack_c0._4_4_ = 0;
      auStack_c0._8_4_ = 0;
      auStack_c0._12_4_ = 0;
      auStack_c0._16_4_ = YAML_ANY_SCALAR_STYLE;
      uStack_9c = (undefined4)sVar41;
      uStack_98 = (undefined4)(sVar41 >> 0x20);
      auStack_c0._20_4_ = (undefined4)sVar15;
      local_a8 = (undefined4)(sVar15 >> 0x20);
      uStack_a4 = (undefined4)sVar16;
      uStack_a0 = (undefined4)(sVar16 >> 0x20);
      ppyVar3 = &(parser->tokens).tail;
      pyVar34 = (parser->tokens).tail;
      if (pyVar34 == (parser->tokens).end) {
        iVar27 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,ppyVar3,
                                   &(parser->tokens).end);
        if (iVar27 == 0) goto LAB_00196a23;
        pyVar34 = *ppyVar3;
      }
      *ppyVar3 = pyVar34 + 1;
      pyVar34->type = YAML_BLOCK_ENTRY_TOKEN;
      goto LAB_001969d8;
    }
    goto switchD_00195582_caseD_4;
  case 0x1a:
switchD_00195582_caseD_1a:
    if (parser->flow_level != 0) {
      pyVar29 = (parser->simple_keys).top;
      if (pyVar29[-1].possible != 0) {
LAB_00195cd6:
        auStack_c0._8_4_ = 0;
        auStack_c0._12_4_ = 0;
        auStack_c0._16_4_ = YAML_ANY_SCALAR_STYLE;
        handle_value._0_4_ = 0;
        handle_value._4_4_ = 0;
        auStack_c0._0_4_ = 0;
        auStack_c0._4_4_ = 0;
        sVar41 = pyVar29[-1].mark.column;
        uStack_9c = (undefined4)sVar41;
        uStack_98 = (undefined4)(sVar41 >> 0x20);
        sVar41 = pyVar29[-1].mark.index;
        sVar15 = pyVar29[-1].mark.line;
        auStack_c0._20_4_ = (undefined4)sVar41;
        local_a8 = (undefined4)(sVar41 >> 0x20);
        uStack_a4 = (undefined4)sVar15;
        uStack_a0 = (undefined4)(sVar15 >> 0x20);
        end_mark.column = pyVar29[-1].mark.column;
        end_mark.index = pyVar29[-1].mark.index;
        end_mark.line = pyVar29[-1].mark.line;
        pyVar34 = (parser->tokens).tail;
        if (pyVar34 == (parser->tokens).end) {
          ppyVar3 = &(parser->tokens).tail;
          iVar27 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,ppyVar3,
                                     &(parser->tokens).end);
          if (iVar27 == 0) goto LAB_0019653f;
          pyVar34 = *ppyVar3;
        }
        lVar44 = pyVar29[-1].token_number - parser->tokens_parsed;
        pyVar11 = (parser->tokens).head;
        memmove(pyVar11 + lVar44 + 1,pyVar11 + lVar44,
                (((long)pyVar34 - (long)pyVar11) / 0x50 - lVar44) * 0x50);
        pyVar34 = (parser->tokens).head;
        lVar44 = pyVar29[-1].token_number - parser->tokens_parsed;
        pyVar34[lVar44].type = YAML_KEY_TOKEN;
        *(undefined4 *)((long)&pyVar34[lVar44].start_mark.column + 4) = uStack_98;
        puVar5 = (undefined8 *)((long)&pyVar34[lVar44].start_mark.index + 4);
        *puVar5 = CONCAT44(uStack_a4,local_a8);
        puVar5[1] = CONCAT44(uStack_9c,uStack_a0);
        puVar5 = (undefined8 *)((long)&pyVar34[lVar44].data.scalar.length + 4);
        *puVar5 = CONCAT44(auStack_c0._12_4_,auStack_c0._8_4_);
        puVar5[1] = CONCAT44(auStack_c0._20_4_,auStack_c0._16_4_);
        *(ulong *)&pyVar34[lVar44].field_0x4 = CONCAT44(handle_value._4_4_,(int)handle_value);
        *(ulong *)(&pyVar34[lVar44].field_0x4 + 8) = CONCAT44(auStack_c0._4_4_,auStack_c0._0_4_);
        pyVar34[lVar44].end_mark.index = end_mark.index;
        pyVar34[lVar44].end_mark.line = end_mark.line;
        pyVar34[lVar44].end_mark.column = end_mark.column;
        ppyVar3 = &(parser->tokens).tail;
        *ppyVar3 = *ppyVar3 + 1;
        iVar27 = yaml_parser_roll_indent
                           (parser,pyVar29[-1].mark.column,pyVar29[-1].token_number,
                            YAML_BLOCK_MAPPING_START_TOKEN,pyVar29[-1].mark);
        if (iVar27 == 0) {
          return 0;
        }
        pyVar29[-1].possible = 0;
      }
      uVar39 = 0;
LAB_00195e48:
      parser->simple_key_allowed = uVar39;
      sVar41 = (parser->mark).column;
      sVar15 = pyVar2->index;
      sVar16 = (parser->mark).line;
      (parser->mark).index = (parser->mark).index + 1;
      psVar4 = &(parser->mark).column;
      *psVar4 = *psVar4 + 1;
      parser->unread = parser->unread - 1;
      pbVar33 = (parser->buffer).pointer;
      bVar49 = *pbVar33;
      if ((char)bVar49 < '\0') {
        if ((bVar49 & 0xe0) == 0xc0) {
          lStackY_170 = 2;
        }
        else if ((bVar49 & 0xf0) == 0xe0) {
          lStackY_170 = 3;
        }
        else {
          lStackY_170 = (ulong)((bVar49 & 0xf8) == 0xf0) << 2;
        }
      }
      else {
        lStackY_170 = 1;
      }
      (parser->buffer).pointer = pbVar33 + lStackY_170;
      end_mark.column = (parser->mark).column;
      end_mark.index = pyVar2->index;
      end_mark.line = (parser->mark).line;
      handle_value._0_4_ = 0;
      handle_value._4_4_ = 0;
      auStack_c0._0_4_ = 0;
      auStack_c0._4_4_ = 0;
      auStack_c0._8_4_ = 0;
      auStack_c0._12_4_ = 0;
      auStack_c0._16_4_ = YAML_ANY_SCALAR_STYLE;
      uStack_9c = (undefined4)sVar41;
      uStack_98 = (undefined4)(sVar41 >> 0x20);
      auStack_c0._20_4_ = (undefined4)sVar15;
      local_a8 = (undefined4)(sVar15 >> 0x20);
      uStack_a4 = (undefined4)sVar16;
      uStack_a0 = (undefined4)(sVar16 >> 0x20);
      ppyVar3 = &(parser->tokens).tail;
      pyVar34 = (parser->tokens).tail;
      if (pyVar34 == (parser->tokens).end) {
        iVar27 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,ppyVar3,
                                   &(parser->tokens).end);
        if (iVar27 == 0) {
LAB_0019653f:
          parser->error = YAML_MEMORY_ERROR;
          return 0;
        }
        pyVar34 = *ppyVar3;
      }
      *ppyVar3 = pyVar34 + 1;
      pyVar34->type = YAML_VALUE_TOKEN;
      goto LAB_001969d8;
    }
    bVar6 = pbVar33[1];
    if (((ulong)bVar6 < 0x21) && ((0x100002601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) {
LAB_00195cc3:
      pyVar29 = (parser->simple_keys).top;
      if (pyVar29[-1].possible != 0) goto LAB_00195cd6;
      if (parser->simple_key_allowed == 0) {
        parser->error = YAML_SCANNER_ERROR;
        parser->context = (char *)0x0;
        sVar41 = (parser->mark).line;
        (parser->context_mark).index = pyVar2->index;
        (parser->context_mark).line = sVar41;
        (parser->context_mark).column = (parser->mark).column;
        pcVar31 = "mapping values are not allowed in this context";
LAB_00196ac8:
        parser->problem = pcVar31;
        sVar41 = (parser->mark).line;
        (parser->problem_mark).index = pyVar2->index;
        (parser->problem_mark).line = sVar41;
        (parser->problem_mark).column = (parser->mark).column;
        return 0;
      }
      iVar27 = yaml_parser_roll_indent(parser,sVar41,-1,YAML_BLOCK_MAPPING_START_TOKEN,*pyVar2);
      if (iVar27 == 0) {
        return 0;
      }
      uVar39 = (uint)(parser->flow_level == 0);
      goto LAB_00195e48;
    }
    if (bVar6 == 0xe2) break;
    if (bVar6 == 0xc2) {
      if (pbVar33[2] == 0x85) goto LAB_00195cc3;
      break;
    }
    goto LAB_00195bb9;
  case 0x1e:
switchD_00195582_caseD_1e:
    if (parser->flow_level == 0) {
      iVar27 = 0;
LAB_00195b86:
      iVar27 = yaml_parser_fetch_block_scalar(parser,iVar27);
      return iVar27;
    }
    goto LAB_00195bd1;
  case 0x1f:
switchD_00195582_caseD_1f:
    if (parser->flow_level != 0) goto LAB_00195a68;
    bVar6 = pbVar33[1];
    if (((ulong)bVar6 < 0x21) && ((0x100002601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) {
LAB_00195eaa:
      if (parser->simple_key_allowed == 0) {
        parser->error = YAML_SCANNER_ERROR;
        parser->context = (char *)0x0;
        sVar41 = (parser->mark).line;
        (parser->context_mark).index = pyVar2->index;
        (parser->context_mark).line = sVar41;
        (parser->context_mark).column = (parser->mark).column;
        parser->problem = "mapping keys are not allowed in this context";
        sVar41 = (parser->mark).line;
        (parser->problem_mark).index = pyVar2->index;
        (parser->problem_mark).line = sVar41;
        (parser->problem_mark).column = (parser->mark).column;
        return 0;
      }
      iVar27 = yaml_parser_roll_indent(parser,sVar41,-1,YAML_BLOCK_MAPPING_START_TOKEN,*pyVar2);
      if (iVar27 == 0) {
        return 0;
      }
LAB_00195a68:
      iVar27 = yaml_parser_remove_simple_key(parser);
      if (iVar27 == 0) {
        return 0;
      }
      parser->simple_key_allowed = (uint)(parser->flow_level == 0);
      sVar41 = (parser->mark).column;
      sVar15 = pyVar2->index;
      sVar16 = (parser->mark).line;
      (parser->mark).index = (parser->mark).index + 1;
      psVar4 = &(parser->mark).column;
      *psVar4 = *psVar4 + 1;
      parser->unread = parser->unread - 1;
      pbVar33 = (parser->buffer).pointer;
      bVar49 = *pbVar33;
      if ((char)bVar49 < '\0') {
        if ((bVar49 & 0xe0) == 0xc0) {
          lStackY_170 = 2;
        }
        else if ((bVar49 & 0xf0) == 0xe0) {
          lStackY_170 = 3;
        }
        else {
          lStackY_170 = (ulong)((bVar49 & 0xf8) == 0xf0) << 2;
        }
      }
      else {
        lStackY_170 = 1;
      }
      (parser->buffer).pointer = pbVar33 + lStackY_170;
      end_mark.column = (parser->mark).column;
      end_mark.index = pyVar2->index;
      end_mark.line = (parser->mark).line;
      handle_value._0_4_ = 0;
      handle_value._4_4_ = 0;
      auStack_c0._0_4_ = 0;
      auStack_c0._4_4_ = 0;
      auStack_c0._8_4_ = 0;
      auStack_c0._12_4_ = 0;
      auStack_c0._16_4_ = YAML_ANY_SCALAR_STYLE;
      uStack_9c = (undefined4)sVar41;
      uStack_98 = (undefined4)(sVar41 >> 0x20);
      auStack_c0._20_4_ = (undefined4)sVar15;
      local_a8 = (undefined4)(sVar15 >> 0x20);
      uStack_a4 = (undefined4)sVar16;
      uStack_a0 = (undefined4)(sVar16 >> 0x20);
      ppyVar3 = &(parser->tokens).tail;
      pyVar34 = (parser->tokens).tail;
      if (pyVar34 == (parser->tokens).end) {
        iVar27 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,ppyVar3,
                                   &(parser->tokens).end);
        if (iVar27 == 0) {
          parser->error = YAML_MEMORY_ERROR;
          return 0;
        }
        pyVar34 = *ppyVar3;
      }
      *ppyVar3 = pyVar34 + 1;
      pyVar34->type = YAML_KEY_TOKEN;
      *(ulong *)&pyVar34->field_0x4 = CONCAT44(handle_value._4_4_,(int)handle_value);
      *(ulong *)((long)&(pyVar34->data).alias.value + 4) =
           CONCAT44(auStack_c0._4_4_,auStack_c0._0_4_);
      *(ulong *)((long)&(pyVar34->data).scalar.length + 4) =
           CONCAT44(auStack_c0._12_4_,auStack_c0._8_4_);
      *(ulong *)((long)&pyVar34->data + 0x14) = CONCAT44(auStack_c0._20_4_,auStack_c0._16_4_);
      *(ulong *)((long)&(pyVar34->start_mark).index + 4) = CONCAT44(uStack_a4,local_a8);
      *(ulong *)((long)&(pyVar34->start_mark).line + 4) = CONCAT44(uStack_9c,uStack_a0);
      *(undefined4 *)((long)&(pyVar34->start_mark).column + 4) = uStack_98;
      (pyVar34->end_mark).index = end_mark.index;
      (pyVar34->end_mark).line = end_mark.line;
      (pyVar34->end_mark).column = end_mark.column;
      return local_6c;
    }
    if (bVar6 != 0xe2) {
      if (bVar6 != 0xc2) goto LAB_00195bb9;
      if (pbVar33[2] == 0x85) goto LAB_00195eaa;
    }
    break;
  default:
switchD_00195582_default:
    if ((1 < bVar38 - 9) && (bVar38 != 0xd)) {
      if (bVar38 == 0x5b) {
        lStackY_170._0_4_ = YAML_FLOW_SEQUENCE_START_TOKEN;
LAB_00195c3b:
        iVar27 = yaml_parser_fetch_flow_collection_start(parser,(yaml_token_type_t)lStackY_170);
        return iVar27;
      }
      if (bVar38 == 0x5d) {
        lStackY_170._0_4_ = YAML_FLOW_SEQUENCE_END_TOKEN;
LAB_00195c1f:
        iVar27 = yaml_parser_fetch_flow_collection_end(parser,(yaml_token_type_t)lStackY_170);
        return iVar27;
      }
      if (bVar38 != 0x60) {
        if (bVar38 == 0x7b) {
          lStackY_170._0_4_ = YAML_FLOW_MAPPING_START_TOKEN;
          goto LAB_00195c3b;
        }
        if (bVar38 == 0x7c) {
          if (parser->flow_level == 0) {
            iVar27 = 1;
            goto LAB_00195b86;
          }
          goto LAB_00195bd1;
        }
        if (bVar38 == 0x7d) {
          lStackY_170._0_4_ = YAML_FLOW_MAPPING_END_TOKEN;
          goto LAB_00195c1f;
        }
        if ((bVar38 != 0xc2) || (pbVar33[1] != 0x85)) goto switchD_00195582_caseD_4;
      }
    }
  }
switchD_00195582_caseD_0:
  if ((parser->flow_level != 0) || ((bVar38 != 0x3f && (bVar38 != 0x3a)))) {
LAB_00195bd1:
    parser->error = YAML_SCANNER_ERROR;
    parser->context = "while scanning for the next token";
    sVar41 = (parser->mark).line;
    (parser->context_mark).index = pyVar2->index;
    (parser->context_mark).line = sVar41;
    (parser->context_mark).column = (parser->mark).column;
    parser->problem = "found character that cannot start any token";
    sVar41 = (parser->mark).line;
    (parser->problem_mark).index = pyVar2->index;
    (parser->problem_mark).line = sVar41;
    (parser->problem_mark).column = (parser->mark).column;
    return 0;
  }
LAB_00195bb9:
  bVar38 = pbVar33[1];
  if ((((ulong)bVar38 < 0x21) && ((0x100002601U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) ||
     (((bVar38 != 0xe2 && (bVar38 == 0xc2)) && (pbVar33[2] == 0x85)))) goto LAB_00195bd1;
switchD_00195582_caseD_4:
  iVar27 = yaml_parser_save_simple_key(parser);
  if (iVar27 == 0) {
    return 0;
  }
  parser->simple_key_allowed = 0;
  pauStack_120 = (undefined1 (*) [16])0x0;
  apauStack_118[0] = (undefined1 (*) [16])0x0;
  _local_108 = (undefined1  [16])0x0;
  local_f8[0] = (undefined1 (*) [16])0x0;
  _local_e8 = (undefined1  [16])0x0;
  local_d8[0] = (undefined1 (*) [16])0x0;
  _local_48 = (undefined1  [16])0x0;
  local_38 = (undefined1 (*) [16])0x0;
  iVar27 = parser->indent;
  pauVar30 = (undefined1 (*) [16])yaml_malloc(0x10);
  major = (int)pauVar30;
  iStack_124 = (int)((ulong)pauVar30 >> 0x20);
  if (pauVar30 != (undefined1 (*) [16])0x0) {
    pauStack_120 = pauVar30 + 1;
    *pauVar30 = (undefined1  [16])0x0;
    apauStack_118[0] = pauVar30;
    pauVar30 = (undefined1 (*) [16])yaml_malloc(0x10);
    local_108 = (undefined1  [8])pauVar30;
    if (pauVar30 != (undefined1 (*) [16])0x0) {
      pauStack_100 = pauVar30 + 1;
      *pauVar30 = (undefined1  [16])0x0;
      local_f8[0] = pauVar30;
      pauVar30 = (undefined1 (*) [16])yaml_malloc(0x10);
      local_e8 = (undefined1  [8])pauVar30;
      if (pauVar30 != (undefined1 (*) [16])0x0) {
        pauStack_e0 = pauVar30 + 1;
        *pauVar30 = (undefined1  [16])0x0;
        local_d8[0] = pauVar30;
        pauVar30 = (undefined1 (*) [16])yaml_malloc(0x10);
        local_48 = (undefined1  [8])pauVar30;
        if (pauVar30 != (undefined1 (*) [16])0x0) {
          local_38 = pauVar30;
          pauStack_40 = pauVar30 + 1;
          *pauVar30 = (undefined1  [16])0x0;
          end_mark.column = (parser->mark).column;
          end_mark.index = pyVar2->index;
          end_mark.line = (parser->mark).line;
          sVar15 = pyVar2->index;
          sVar16 = (parser->mark).line;
          sVar41 = (parser->mark).column;
          bVar48 = false;
LAB_00196f9a:
          if ((parser->unread < 4) && (iVar28 = yaml_parser_update_buffer(parser,4), iVar28 == 0))
          goto LAB_00197bbe;
          pbVar33 = (parser->buffer).pointer;
          bVar38 = *pbVar33;
          if ((parser->mark).column == 0) {
            if (bVar38 == 0x2d) {
              if ((pbVar33[1] != 0x2d) || (pbVar33[2] != 0x2d)) goto LAB_00196fd7;
            }
            else {
              if (bVar38 != 0x2e) goto joined_r0x00196fd1;
              if ((pbVar33[1] != 0x2e) || (pbVar33[2] != 0x2e)) goto LAB_00196fd7;
            }
            bVar6 = pbVar33[3];
            if (bVar6 == 0xc2) {
              if (pbVar33[4] == 0x85) goto LAB_00197a82;
            }
            else if (((bVar6 != 0xe2) && (bVar6 < 0x21)) &&
                    ((0x100002601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) goto LAB_00197a82;
          }
          else {
joined_r0x00196fd1:
            if (bVar38 == 0x23) goto LAB_00197a82;
          }
LAB_00196fd7:
          do {
            uVar39 = (uint)bVar38;
            if (bVar38 == 0xc2) {
              if (pbVar33[1] == 0x85) goto LAB_00197425;
            }
            else if ((bVar38 != 0xe2) && (bVar38 < 0x21)) {
              if ((0x100002600U >> ((ulong)uVar39 & 0x3f) & 1) != 0) goto LAB_00197425;
              if ((ulong)uVar39 == 0) goto LAB_00197a82;
            }
            if (parser->flow_level == 0) {
              if (bVar38 == 0x3a) {
                bVar38 = pbVar33[1];
LAB_0019707c:
                if (bVar38 == 0xc2) {
                  if (pbVar33[2] == 0x85) goto LAB_00197a82;
                }
                else if (((bVar38 != 0xe2) && (bVar38 < 0x21)) &&
                        ((0x100002601U >> ((ulong)(uint)bVar38 & 0x3f) & 1) != 0))
                goto LAB_00197a82;
              }
            }
            else {
              uVar40 = bVar38 - 0x2c;
              if (uVar40 < 0x32) {
                if ((ulong)uVar40 == 0xe) {
                  bVar38 = pbVar33[1];
                  if (((0x3e < bVar38 - 0x3f) ||
                      ((0x5000000050000001U >> ((ulong)(bVar38 - 0x3f) & 0x3f) & 1) == 0)) &&
                     (bVar38 != 0x2c)) goto LAB_0019707c;
                  parser->error = YAML_SCANNER_ERROR;
                  parser->context = "while scanning a plain scalar";
                  (parser->context_mark).index = sVar15;
                  (parser->context_mark).line = sVar16;
                  (parser->context_mark).column = sVar41;
                  pcVar31 = "found unexpected \':\'";
                  goto LAB_00197c4c;
                }
                if ((0x2800000080001U >> ((ulong)uVar40 & 0x3f) & 1) != 0) goto LAB_00197a82;
              }
              if ((uVar39 == 0x7b) || (bVar38 == 0x7d)) goto LAB_00197a82;
            }
            if (bVar48) {
              if (*(yaml_char_t *)local_108 == '\n') {
                if (*(yaml_char_t *)local_e8 == '\0') {
                  if ((pauStack_120 <= (undefined1 (*) [16])(*apauStack_118[0] + 5)) &&
                     (iVar28 = yaml_string_extend((yaml_char_t **)&major,
                                                  (yaml_char_t **)apauStack_118,
                                                  (yaml_char_t **)&pauStack_120), iVar28 == 0))
                  break;
                  (*apauStack_118[0])[0] = 0x20;
                  apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                }
                else {
                  iVar28 = yaml_string_join((yaml_char_t **)&major,(yaml_char_t **)apauStack_118,
                                            (yaml_char_t **)&pauStack_120,(yaml_char_t **)local_e8,
                                            (yaml_char_t **)local_d8,(yaml_char_t **)(local_e8 + 8))
                  ;
                  if (iVar28 == 0) break;
                  local_d8[0] = (undefined1 (*) [16])local_e8;
                  memset((void *)local_e8,0,(long)pauStack_e0 - (long)local_e8);
                }
                local_f8[0] = (undefined1 (*) [16])local_108;
                plVar35 = (long *)(local_108 + 8);
                auVar47 = local_108;
              }
              else {
                iVar28 = yaml_string_join((yaml_char_t **)&major,(yaml_char_t **)apauStack_118,
                                          (yaml_char_t **)&pauStack_120,(yaml_char_t **)local_108,
                                          (yaml_char_t **)local_f8,(yaml_char_t **)(local_108 + 8));
                if (iVar28 == 0) break;
                local_f8[0] = (undefined1 (*) [16])local_108;
                iVar28 = yaml_string_join((yaml_char_t **)&major,(yaml_char_t **)apauStack_118,
                                          (yaml_char_t **)&pauStack_120,(yaml_char_t **)local_e8,
                                          (yaml_char_t **)local_d8,(yaml_char_t **)(local_e8 + 8));
                if (iVar28 == 0) break;
                local_f8[0] = (undefined1 (*) [16])local_108;
                memset((void *)local_108,0,(long)pauStack_100 - (long)local_108);
                local_d8[0] = (undefined1 (*) [16])local_e8;
                plVar35 = (long *)(local_e8 + 8);
                auVar47 = local_e8;
              }
LAB_001972a8:
              memset((void *)auVar47,0,*plVar35 - (long)auVar47);
            }
            else if (local_48 != (undefined1  [8])local_38) {
              iVar28 = yaml_string_join((yaml_char_t **)&major,(yaml_char_t **)apauStack_118,
                                        (yaml_char_t **)&pauStack_120,(yaml_char_t **)local_48,
                                        (yaml_char_t **)&local_38,(yaml_char_t **)(local_48 + 8));
              if (iVar28 != 0) {
                local_38 = (undefined1 (*) [16])local_48;
                plVar35 = (long *)(local_48 + 8);
                auVar47 = local_48;
                goto LAB_001972a8;
              }
              break;
            }
            if ((pauStack_120 <= (undefined1 (*) [16])(*apauStack_118[0] + 5)) &&
               (iVar28 = yaml_string_extend((yaml_char_t **)&major,(yaml_char_t **)apauStack_118,
                                            (yaml_char_t **)&pauStack_120), iVar28 == 0)) break;
            pbVar33 = (parser->buffer).pointer;
            bVar38 = *pbVar33;
            if ((char)bVar38 < '\0') {
              if ((bVar38 & 0xe0) == 0xc0) {
LAB_00197362:
                (parser->buffer).pointer = pbVar33 + 1;
                (*apauStack_118[0])[0] = *pbVar33;
                pbVar33 = (parser->buffer).pointer;
                apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                goto LAB_00197386;
              }
              if ((bVar38 & 0xf0) == 0xe0) {
LAB_0019733e:
                (parser->buffer).pointer = pbVar33 + 1;
                (*apauStack_118[0])[0] = *pbVar33;
                pbVar33 = (parser->buffer).pointer;
                apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                goto LAB_00197362;
              }
              if ((bVar38 & 0xf8) == 0xf0) {
                (parser->buffer).pointer = pbVar33 + 1;
                (*apauStack_118[0])[0] = *pbVar33;
                pbVar33 = (parser->buffer).pointer;
                apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                goto LAB_0019733e;
              }
            }
            else {
LAB_00197386:
              (parser->buffer).pointer = pbVar33 + 1;
              (*apauStack_118[0])[0] = *pbVar33;
              apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
            }
            (parser->mark).index = (parser->mark).index + 1;
            psVar4 = &(parser->mark).column;
            *psVar4 = *psVar4 + 1;
            uVar36 = parser->unread - 1;
            parser->unread = uVar36;
            end_mark.column = (parser->mark).column;
            end_mark.index = pyVar2->index;
            end_mark.line = (parser->mark).line;
            if ((uVar36 < 2) && (iVar28 = yaml_parser_update_buffer(parser,2), iVar28 == 0))
            goto LAB_00197bbe;
            pbVar33 = (parser->buffer).pointer;
            bVar38 = *pbVar33;
            bVar48 = false;
          } while( true );
        }
      }
    }
  }
LAB_00197bb8:
  parser->error = YAML_MEMORY_ERROR;
LAB_00197bbe:
  yaml_free((void *)CONCAT44(iStack_124,major));
  major = 0;
  iStack_124 = 0;
  pauStack_120 = (undefined1 (*) [16])0x0;
  apauStack_118[0] = (undefined1 (*) [16])0x0;
  yaml_free((void *)local_108);
  _local_108 = (undefined1  [16])0x0;
  local_f8[0] = (undefined1 (*) [16])0x0;
  yaml_free((void *)local_e8);
  _local_e8 = (undefined1  [16])0x0;
  local_d8[0] = (undefined1 (*) [16])0x0;
  auVar47 = local_48;
  goto LAB_0019595d;
LAB_00196170:
  do {
    pbVar33 = (parser->buffer).pointer;
    if ((*pbVar33 != 0x20) && (*pbVar33 != 9)) {
      iVar27 = yaml_parser_scan_version_directive_number(parser,yVar17,&major);
      if (iVar27 != 0) {
        pbVar33 = (parser->buffer).pointer;
        if (*pbVar33 != 0x2e) {
          parser->error = YAML_SCANNER_ERROR;
          parser->context = "while scanning a %YAML directive";
          (parser->context_mark).index = sVar15;
          (parser->context_mark).line = sVar16;
          (parser->context_mark).column = sVar41;
          pcVar31 = "did not find expected digit or \'.\' character";
LAB_001959ed:
          parser->problem = pcVar31;
          sVar41 = (parser->mark).line;
          (parser->problem_mark).index = pyVar2->index;
          (parser->problem_mark).line = sVar41;
          (parser->problem_mark).column = (parser->mark).column;
          goto LAB_00195947;
        }
        (parser->mark).index = (parser->mark).index + 1;
        psVar4 = &(parser->mark).column;
        *psVar4 = *psVar4 + 1;
        parser->unread = parser->unread - 1;
        bVar38 = *pbVar33;
        if ((char)bVar38 < '\0') {
          if ((bVar38 & 0xe0) == 0xc0) {
            lStackY_170 = 2;
          }
          else if ((bVar38 & 0xf0) == 0xe0) {
            lStackY_170 = 3;
          }
          else {
            lStackY_170 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
          }
        }
        else {
          lStackY_170 = 1;
        }
        (parser->buffer).pointer = pbVar33 + lStackY_170;
        iVar27 = yaml_parser_scan_version_directive_number(parser,yVar20,(int *)local_108);
        if (iVar27 != 0) {
          auStack_c0._8_4_ = 0;
          auStack_c0._12_4_ = 0;
          handle_value._0_4_ = 3;
          local_90 = pyVar2->index;
          sStack_88 = (parser->mark).line;
          local_80 = (parser->mark).column;
          auStack_c0._0_4_ = major;
          auStack_c0._4_4_ = local_108._0_4_;
          ptr_00 = (void *)0x0;
          ptr = (void *)0x0;
          goto LAB_00197f14;
        }
      }
      goto LAB_00195947;
    }
    (parser->mark).index = (parser->mark).index + 1;
    psVar4 = &(parser->mark).column;
    *psVar4 = *psVar4 + 1;
    sVar43 = parser->unread - 1;
    parser->unread = sVar43;
    bVar38 = *pbVar33;
    lVar44 = 1;
    if ((((char)bVar38 < '\0') && (lVar44 = 2, (bVar38 & 0xe0) != 0xc0)) &&
       (lVar44 = 3, (bVar38 & 0xf0) != 0xe0)) {
      lVar44 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
    }
    (parser->buffer).pointer = pbVar33 + lVar44;
    if (sVar43 == 0) break;
  } while( true );
  iVar27 = yaml_parser_update_buffer(parser,1);
  if (iVar27 == 0) goto LAB_00195947;
  goto LAB_00196170;
  while( true ) {
    iVar27 = yaml_parser_update_buffer(parser,1);
    if (iVar27 == 0) break;
LAB_0019631d:
    do {
      pbVar33 = (parser->buffer).pointer;
      if ((*pbVar33 != 0x20) && (*pbVar33 != 9)) {
        iVar27 = yaml_parser_scan_tag_handle(parser,1,yVar18,&handle_value);
        if (iVar27 == 0) goto LAB_00196ddb;
        if (parser->unread == 0) {
          iVar27 = yaml_parser_update_buffer(parser,1);
          if (iVar27 == 0) goto LAB_00196ddb;
        }
        pbVar33 = (parser->buffer).pointer;
        bVar38 = *pbVar33;
        if ((bVar38 == 0x20) || (bVar38 == 9)) {
          goto LAB_0019685a;
        }
        pcVar31 = "did not find expected whitespace";
        goto LAB_00196d9e;
      }
      (parser->mark).index = (parser->mark).index + 1;
      psVar4 = &(parser->mark).column;
      *psVar4 = *psVar4 + 1;
      sVar43 = parser->unread - 1;
      parser->unread = sVar43;
      bVar38 = *pbVar33;
      lVar44 = 1;
      if ((((char)bVar38 < '\0') && (lVar44 = 2, (bVar38 & 0xe0) != 0xc0)) &&
         (lVar44 = 3, (bVar38 & 0xf0) != 0xe0)) {
        lVar44 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar33 + lVar44;
    } while (sVar43 != 0);
  }
  goto LAB_00196ddb;
LAB_00197425:
  sVar43 = parser->unread;
  do {
    while( true ) {
      if ((sVar43 == 0) && (iVar28 = yaml_parser_update_buffer(parser,1), iVar28 == 0))
      goto LAB_00197bbe;
      pbVar33 = (parser->buffer).pointer;
      bVar38 = *pbVar33;
      if (bVar38 != 9) break;
LAB_0019751e:
      if (bVar48) {
        sVar43 = (parser->mark).column;
        if (bVar38 != 9 || iVar27 < (int)sVar43) {
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = sVar43 + 1;
          parser->unread = parser->unread - 1;
          bVar38 = *pbVar33;
          lVar44 = 1;
          if ((((char)bVar38 < '\0') && (lVar44 = 2, (bVar38 & 0xe0) != 0xc0)) &&
             (lVar44 = 3, (bVar38 & 0xf0) != 0xe0)) {
            lVar44 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
          }
          (parser->buffer).pointer = pbVar33 + lVar44;
          goto LAB_00197a4f;
        }
        parser->error = YAML_SCANNER_ERROR;
        parser->context = "while scanning a plain scalar";
        (parser->context_mark).index = sVar15;
        (parser->context_mark).line = sVar16;
        (parser->context_mark).column = sVar41;
        pcVar31 = "found a tab character that violate indentation";
LAB_00197c4c:
        parser->problem = pcVar31;
        sVar41 = (parser->mark).line;
        (parser->problem_mark).index = pyVar2->index;
        (parser->problem_mark).line = sVar41;
        (parser->problem_mark).column = (parser->mark).column;
        goto LAB_00197bbe;
      }
      if (*local_38 + 5 < pauStack_40) {
LAB_001977e0:
        pauVar30 = local_38;
        (parser->buffer).pointer = pbVar33 + 1;
        local_38 = (undefined1 (*) [16])(*local_38 + 1);
        (*pauVar30)[0] = *pbVar33;
      }
      else {
        iVar28 = yaml_string_extend((yaml_char_t **)local_48,(yaml_char_t **)&local_38,
                                    (yaml_char_t **)(local_48 + 8));
        if (iVar28 == 0) goto LAB_00197bb8;
        pbVar33 = (parser->buffer).pointer;
        bVar38 = *pbVar33;
        if (-1 < (char)bVar38) goto LAB_001977e0;
        if ((bVar38 & 0xe0) == 0xc0) {
LAB_001977b6:
          (parser->buffer).pointer = pbVar33 + 1;
          (*local_38)[0] = *pbVar33;
          pbVar33 = (parser->buffer).pointer;
          local_38 = (undefined1 (*) [16])(*local_38 + 1);
          goto LAB_001977e0;
        }
        if ((bVar38 & 0xf0) == 0xe0) {
LAB_0019778c:
          (parser->buffer).pointer = pbVar33 + 1;
          (*local_38)[0] = *pbVar33;
          pbVar33 = (parser->buffer).pointer;
          local_38 = (undefined1 (*) [16])(*local_38 + 1);
          goto LAB_001977b6;
        }
        if ((bVar38 & 0xf8) == 0xf0) {
          (parser->buffer).pointer = pbVar33 + 1;
          (*local_38)[0] = *pbVar33;
          pbVar33 = (parser->buffer).pointer;
          local_38 = (undefined1 (*) [16])(*local_38 + 1);
          goto LAB_0019778c;
        }
      }
      (parser->mark).index = (parser->mark).index + 1;
      psVar4 = &(parser->mark).column;
      *psVar4 = *psVar4 + 1;
      sVar43 = parser->unread - 1;
      parser->unread = sVar43;
      bVar48 = false;
    }
    if ((bVar38 != 10) && (bVar38 != 0xd)) {
      if (bVar38 == 0x20) goto LAB_0019751e;
      if (((bVar38 == 0xe2) || (bVar38 != 0xc2)) || (pbVar33[1] != 0x85)) break;
    }
    if ((parser->unread < 2) && (iVar28 = yaml_parser_update_buffer(parser,2), iVar28 == 0))
    goto LAB_00197bbe;
    if (!bVar48) {
      local_38 = (undefined1 (*) [16])local_48;
      memset((void *)local_48,0,(long)pauStack_40 - (long)local_48);
      if ((*local_f8[0] + 5 < pauStack_100) ||
         (iVar28 = yaml_string_extend((yaml_char_t **)local_108,(yaml_char_t **)local_f8,
                                      (yaml_char_t **)(local_108 + 8)), iVar28 != 0)) {
        pyVar12 = (parser->buffer).pointer;
        yVar7 = *pyVar12;
        if (yVar7 == 0xe2) goto LAB_00197a4f;
        pauVar30 = local_f8[0];
        if (yVar7 != '\r') {
          if (yVar7 == 0xc2) {
            if (pyVar12[1] == 0x85) {
              local_f8[0] = (undefined1 (*) [16])(*local_f8[0] + 1);
LAB_00197990:
              (*pauVar30)[0] = 10;
              ppyVar46 = &(parser->buffer).pointer;
              *ppyVar46 = *ppyVar46 + 2;
              goto LAB_00197a1c;
            }
          }
          else if (yVar7 == '\n') goto LAB_00197960;
          goto LAB_00197a4f;
        }
        if (pyVar12[1] != '\n') {
LAB_00197960:
          local_f8[0] = (undefined1 (*) [16])(*local_f8[0] + 1);
          goto LAB_00197969;
        }
        local_f8[0] = (undefined1 (*) [16])(*local_f8[0] + 1);
LAB_00197925:
        (*pauVar30)[0] = 10;
        ppyVar46 = &(parser->buffer).pointer;
        *ppyVar46 = *ppyVar46 + 2;
        (parser->mark).column = 0;
        (parser->mark).index = (parser->mark).index + 2;
        (parser->mark).line = (parser->mark).line + 1;
        sVar43 = parser->unread - 2;
LAB_00197a46:
        parser->unread = sVar43;
        goto LAB_00197a56;
      }
      goto LAB_00197bb8;
    }
    if ((pauStack_e0 <= *local_d8[0] + 5) &&
       (iVar28 = yaml_string_extend((yaml_char_t **)local_e8,(yaml_char_t **)local_d8,
                                    (yaml_char_t **)(local_e8 + 8)), iVar28 == 0))
    goto LAB_00197bb8;
    pauVar30 = local_d8[0];
    pyVar12 = (parser->buffer).pointer;
    yVar7 = *pyVar12;
    if (yVar7 != 0xe2) {
      if (yVar7 == '\r') {
        if (pyVar12[1] == '\n') {
          local_d8[0] = (undefined1 (*) [16])(*local_d8[0] + 1);
          goto LAB_00197925;
        }
LAB_00197849:
        local_d8[0] = (undefined1 (*) [16])(*local_d8[0] + 1);
LAB_00197969:
        (*pauVar30)[0] = 10;
        ppyVar46 = &(parser->buffer).pointer;
        *ppyVar46 = *ppyVar46 + 1;
LAB_00197a1c:
        (parser->mark).column = 0;
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).line = (parser->mark).line + 1;
        sVar43 = parser->unread - 1;
        goto LAB_00197a46;
      }
      if (yVar7 == 0xc2) {
        if (pyVar12[1] == 0x85) {
          local_d8[0] = (undefined1 (*) [16])(*local_d8[0] + 1);
          goto LAB_00197990;
        }
      }
      else if (yVar7 == '\n') goto LAB_00197849;
    }
LAB_00197a4f:
    sVar43 = parser->unread;
LAB_00197a56:
    bVar48 = true;
  } while( true );
  if ((parser->flow_level != 0) || (iVar27 < (int)(parser->mark).column)) goto LAB_00196f9a;
LAB_00197a82:
  handle_value._4_4_ = 0;
  auStack_c0._20_4_ = 0;
  handle_value._0_4_ = 0x15;
  local_a8 = (undefined4)sVar15;
  uStack_a4 = (undefined4)(sVar15 >> 0x20);
  uStack_a0 = (undefined4)sVar16;
  uStack_9c = (undefined4)(sVar16 >> 0x20);
  uStack_98 = (undefined4)sVar41;
  uStack_94 = (undefined4)(sVar41 >> 0x20);
  local_90 = end_mark.index;
  sStack_88 = end_mark.line;
  local_80 = end_mark.column;
  auStack_c0._0_4_ = major;
  auStack_c0._4_4_ = iStack_124;
  auStack_c0._8_8_ = (long)apauStack_118[0] - CONCAT44(iStack_124,major);
  auStack_c0._16_4_ = YAML_PLAIN_SCALAR_STYLE;
  if (bVar48) {
    parser->simple_key_allowed = 1;
  }
  yaml_free((void *)local_108);
  _local_108 = (undefined1  [16])0x0;
  local_f8[0] = (undefined1 (*) [16])0x0;
  yaml_free((void *)local_e8);
  _local_e8 = (undefined1  [16])0x0;
  local_d8[0] = (undefined1 (*) [16])0x0;
  yaml_free((void *)local_48);
  pyVar34 = (parser->tokens).tail;
  if (pyVar34 != (parser->tokens).end) goto LAB_00197d6e;
  iVar27 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,&(parser->tokens).tail,
                             &(parser->tokens).end);
  if (iVar27 == 0) {
    parser->error = YAML_MEMORY_ERROR;
    yaml_token_delete((yaml_token_t *)&handle_value);
    return 0;
  }
LAB_00197d6b:
  pyVar34 = (parser->tokens).tail;
LAB_00197d6e:
  (parser->tokens).tail = pyVar34 + 1;
  ppyVar46 = &handle_value;
  for (lVar44 = 10; lVar44 != 0; lVar44 = lVar44 + -1) {
    *(yaml_char_t **)pyVar34 = *ppyVar46;
    ppyVar46 = ppyVar46 + (ulong)bVar49 * -2 + 1;
    pyVar34 = (yaml_token_t *)((long)pyVar34 + (ulong)bVar49 * -0x10 + 8);
  }
  return 1;
LAB_0019685a:
  if ((bVar38 == 0x20) || (bVar38 == 9)) {
    (parser->mark).index = (parser->mark).index + 1;
    psVar4 = &(parser->mark).column;
    *psVar4 = *psVar4 + 1;
    sVar43 = parser->unread - 1;
    parser->unread = sVar43;
    bVar38 = *pbVar33;
    lVar44 = 1;
    if (((char)bVar38 < '\0') &&
       ((lVar44 = 2, (bVar38 & 0xe0) != 0xc0 && (lVar44 = 3, (bVar38 & 0xf0) != 0xe0)))) {
      lVar44 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
    }
    pbVar33 = pbVar33 + lVar44;
    (parser->buffer).pointer = pbVar33;
    if (sVar43 == 0) {
      iVar27 = yaml_parser_update_buffer(parser,1);
      if (iVar27 != 0) {
        pbVar33 = (parser->buffer).pointer;
        goto LAB_001968ef;
      }
      goto LAB_00196ddb;
    }
LAB_001968ef:
    bVar38 = *pbVar33;
    goto LAB_0019685a;
  }
  iVar27 = yaml_parser_scan_tag_uri(parser,1,(yaml_char_t *)0x0,yVar19,(yaml_char_t **)&end_mark);
  if (iVar27 == 0) goto LAB_00196ddb;
  if (parser->unread == 0) {
    iVar27 = yaml_parser_update_buffer(parser,1);
    if (iVar27 == 0) goto LAB_00196ddb;
  }
  iVar27 = (int)handle_value;
  pbVar33 = (parser->buffer).pointer;
  bVar38 = *pbVar33;
  if ((((ulong)bVar38 < 0x21) && ((0x100002601U >> ((ulong)bVar38 & 0x3f) & 1) != 0)) ||
     ((pcVar31 = "did not find expected whitespace or line break", bVar38 != 0xe2 &&
      ((bVar38 == 0xc2 && (pbVar33[1] == 0x85)))))) {
    ptr_00 = (void *)CONCAT44(handle_value._4_4_,(int)handle_value);
    handle_value._0_4_ = 4;
    local_90 = pyVar2->index;
    sStack_88 = (parser->mark).line;
    local_80 = (parser->mark).column;
    auStack_c0._0_4_ = iVar27;
    auStack_c0._4_4_ = handle_value._4_4_;
    auStack_c0._8_4_ = (undefined4)end_mark.index;
    auStack_c0._12_4_ = (undefined4)(end_mark.index >> 0x20);
    ptr = (void *)end_mark.index;
LAB_00197f14:
    uStack_98 = (undefined4)sVar41;
    uStack_a0 = (undefined4)sVar16;
    local_a8 = (undefined4)sVar15;
    auStack_c0._20_4_ = 0;
    auStack_c0._16_4_ = YAML_ANY_SCALAR_STYLE;
    handle_value._4_4_ = 0;
    uStack_a4 = uVar22;
    uStack_9c = uVar24;
    uStack_94 = uVar26;
    if (parser->unread == 0) {
      iVar27 = yaml_parser_update_buffer(parser,1);
      if (iVar27 != 0) goto LAB_00197f31;
      goto LAB_0019594a;
    }
LAB_00197f31:
    while( true ) {
      pbVar33 = (parser->buffer).pointer;
      bVar38 = *pbVar33;
      uVar39 = (uint)bVar38;
      if ((bVar38 != 9) && (bVar38 != 0x20)) break;
      (parser->mark).index = (parser->mark).index + 1;
      psVar4 = &(parser->mark).column;
      *psVar4 = *psVar4 + 1;
      sVar43 = parser->unread - 1;
      parser->unread = sVar43;
      bVar38 = *pbVar33;
      lVar44 = 1;
      if ((((char)bVar38 < '\0') && (lVar44 = 2, (bVar38 & 0xe0) != 0xc0)) &&
         (lVar44 = 3, (bVar38 & 0xf0) != 0xe0)) {
        lVar44 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar33 + lVar44;
      if (sVar43 == 0) {
        iVar27 = yaml_parser_update_buffer(parser,1);
        if (iVar27 == 0) goto LAB_0019594a;
      }
    }
    if (bVar38 == 0x23) {
      while( true ) {
        if ((char)uVar39 != -0x3e) {
          if (((uVar39 == 0xe2) || (0xd < uVar39)) || ((0x2401U >> (uVar39 & 0x1f) & 1) == 0))
          goto LAB_00198025;
          goto LAB_001980b0;
        }
        if (pbVar33[1] == 0x85) break;
LAB_00198025:
        (parser->mark).index = (parser->mark).index + 1;
        psVar4 = &(parser->mark).column;
        *psVar4 = *psVar4 + 1;
        sVar43 = parser->unread - 1;
        parser->unread = sVar43;
        bVar38 = *pbVar33;
        lVar44 = 1;
        if ((((char)bVar38 < '\0') && (lVar44 = 2, (bVar38 & 0xe0) != 0xc0)) &&
           (lVar44 = 3, (bVar38 & 0xf0) != 0xe0)) {
          lVar44 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
        }
        pbVar33 = pbVar33 + lVar44;
        (parser->buffer).pointer = pbVar33;
        if (sVar43 == 0) {
          iVar27 = yaml_parser_update_buffer(parser,1);
          if (iVar27 == 0) goto LAB_0019594a;
          pbVar33 = (parser->buffer).pointer;
        }
        uVar39 = (uint)*pbVar33;
      }
      bVar38 = 0xc2;
LAB_00198164:
      if (parser->unread < 2) {
        iVar27 = yaml_parser_update_buffer(parser,2);
        if (iVar27 == 0) goto LAB_0019594a;
        pbVar33 = (parser->buffer).pointer;
        bVar38 = *pbVar33;
      }
      if (bVar38 == 10) {
LAB_00198251:
        (parser->mark).column = 0;
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).line = (parser->mark).line - auVar50._8_8_;
        parser->unread = parser->unread - 1;
        bVar38 = *pbVar33;
        if ((char)bVar38 < '\0') {
          if ((bVar38 & 0xe0) == 0xc0) {
LAB_00198290:
            lStackY_170 = 2;
          }
          else if ((bVar38 & 0xf0) == 0xe0) {
            lStackY_170 = 3;
          }
          else {
            lStackY_170 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
          }
        }
        else {
          lStackY_170 = 1;
        }
        (parser->buffer).pointer = pbVar33 + lStackY_170;
      }
      else if (bVar38 != 0xe2) {
        if (bVar38 == 0xc2) {
          if (pbVar33[1] == 0x85) goto LAB_00198251;
        }
        else if (bVar38 == 0xd) {
          if (pbVar33[1] != 10) goto LAB_00198251;
          (parser->mark).column = 0;
          (parser->mark).index = (parser->mark).index + 2;
          (parser->mark).line = (parser->mark).line + 1;
          parser->unread = parser->unread - 2;
          goto LAB_00198290;
        }
      }
    }
    else {
LAB_001980b0:
      bVar38 = (byte)uVar39;
      if (bVar38 != 0) {
        if (((uVar39 != 10) && (uVar39 != 0xd)) &&
           ((uVar39 == 0xe2 || ((uVar39 != 0xc2 || (bVar38 = 0xc2, pbVar33[1] != 0x85)))))) {
          parser->error = YAML_SCANNER_ERROR;
          parser->context = "while scanning a directive";
          (parser->context_mark).index = sVar15;
          (parser->context_mark).line = sVar16;
          (parser->context_mark).column = sVar41;
          parser->problem = "did not find expected comment or line break";
          sVar41 = (parser->mark).line;
          (parser->problem_mark).index = pyVar2->index;
          (parser->problem_mark).line = sVar41;
          (parser->problem_mark).column = (parser->mark).column;
          goto LAB_0019594a;
        }
        goto LAB_00198164;
      }
    }
    yaml_free((void *)auVar47);
    goto LAB_00197d2f;
  }
LAB_00196d9e:
  parser->error = YAML_SCANNER_ERROR;
  parser->context = "while scanning a %TAG directive";
  (parser->context_mark).index = sVar15;
  (parser->context_mark).line = sVar16;
  (parser->context_mark).column = sVar41;
  parser->problem = pcVar31;
  sVar41 = (parser->mark).line;
  (parser->problem_mark).index = pyVar2->index;
  (parser->problem_mark).line = sVar41;
  (parser->problem_mark).column = (parser->mark).column;
LAB_00196ddb:
  yaml_free((void *)CONCAT44(handle_value._4_4_,(int)handle_value));
  yaml_free((void *)end_mark.index);
LAB_00195947:
  ptr_00 = (void *)0x0;
  ptr = (void *)0x0;
LAB_0019594a:
  yaml_free(ptr);
  yaml_free(ptr_00);
LAB_0019595d:
  yaml_free((void *)auVar47);
  return 0;
}

Assistant:

static int
yaml_parser_fetch_next_token(yaml_parser_t *parser)
{
    /* Ensure that the buffer is initialized. */

    if (!CACHE(parser, 1))
        return 0;

    /* Check if we just started scanning.  Fetch STREAM-START then. */

    if (!parser->stream_start_produced)
        return yaml_parser_fetch_stream_start(parser);

    /* Eat whitespaces and comments until we reach the next token. */

    if (!yaml_parser_scan_to_next_token(parser))
        return 0;

    /* Remove obsolete potential simple keys. */

    if (!yaml_parser_stale_simple_keys(parser))
        return 0;

    /* Check the indentation level against the current column. */

    if (!yaml_parser_unroll_indent(parser, parser->mark.column))
        return 0;

    /*
     * Ensure that the buffer contains at least 4 characters.  4 is the length
     * of the longest indicators ('--- ' and '... ').
     */

    if (!CACHE(parser, 4))
        return 0;

    /* Is it the end of the stream? */

    if (IS_Z(parser->buffer))
        return yaml_parser_fetch_stream_end(parser);

    /* Is it a directive? */

    if (parser->mark.column == 0 && CHECK(parser->buffer, '%'))
        return yaml_parser_fetch_directive(parser);

    /* Is it the document start indicator? */

    if (parser->mark.column == 0
            && CHECK_AT(parser->buffer, '-', 0)
            && CHECK_AT(parser->buffer, '-', 1)
            && CHECK_AT(parser->buffer, '-', 2)
            && IS_BLANKZ_AT(parser->buffer, 3))
        return yaml_parser_fetch_document_indicator(parser,
                YAML_DOCUMENT_START_TOKEN);

    /* Is it the document end indicator? */

    if (parser->mark.column == 0
            && CHECK_AT(parser->buffer, '.', 0)
            && CHECK_AT(parser->buffer, '.', 1)
            && CHECK_AT(parser->buffer, '.', 2)
            && IS_BLANKZ_AT(parser->buffer, 3))
        return yaml_parser_fetch_document_indicator(parser,
                YAML_DOCUMENT_END_TOKEN);

    /* Is it the flow sequence start indicator? */

    if (CHECK(parser->buffer, '['))
        return yaml_parser_fetch_flow_collection_start(parser,
                YAML_FLOW_SEQUENCE_START_TOKEN);

    /* Is it the flow mapping start indicator? */

    if (CHECK(parser->buffer, '{'))
        return yaml_parser_fetch_flow_collection_start(parser,
                YAML_FLOW_MAPPING_START_TOKEN);

    /* Is it the flow sequence end indicator? */

    if (CHECK(parser->buffer, ']'))
        return yaml_parser_fetch_flow_collection_end(parser,
                YAML_FLOW_SEQUENCE_END_TOKEN);

    /* Is it the flow mapping end indicator? */

    if (CHECK(parser->buffer, '}'))
        return yaml_parser_fetch_flow_collection_end(parser,
                YAML_FLOW_MAPPING_END_TOKEN);

    /* Is it the flow entry indicator? */

    if (CHECK(parser->buffer, ','))
        return yaml_parser_fetch_flow_entry(parser);

    /* Is it the block entry indicator? */

    if (CHECK(parser->buffer, '-') && IS_BLANKZ_AT(parser->buffer, 1))
        return yaml_parser_fetch_block_entry(parser);

    /* Is it the key indicator? */

    if (CHECK(parser->buffer, '?')
            && (parser->flow_level || IS_BLANKZ_AT(parser->buffer, 1)))
        return yaml_parser_fetch_key(parser);

    /* Is it the value indicator? */

    if (CHECK(parser->buffer, ':')
            && (parser->flow_level || IS_BLANKZ_AT(parser->buffer, 1)))
        return yaml_parser_fetch_value(parser);

    /* Is it an alias? */

    if (CHECK(parser->buffer, '*'))
        return yaml_parser_fetch_anchor(parser, YAML_ALIAS_TOKEN);

    /* Is it an anchor? */

    if (CHECK(parser->buffer, '&'))
        return yaml_parser_fetch_anchor(parser, YAML_ANCHOR_TOKEN);

    /* Is it a tag? */

    if (CHECK(parser->buffer, '!'))
        return yaml_parser_fetch_tag(parser);

    /* Is it a literal scalar? */

    if (CHECK(parser->buffer, '|') && !parser->flow_level)
        return yaml_parser_fetch_block_scalar(parser, 1);

    /* Is it a folded scalar? */

    if (CHECK(parser->buffer, '>') && !parser->flow_level)
        return yaml_parser_fetch_block_scalar(parser, 0);

    /* Is it a single-quoted scalar? */

    if (CHECK(parser->buffer, '\''))
        return yaml_parser_fetch_flow_scalar(parser, 1);

    /* Is it a double-quoted scalar? */

    if (CHECK(parser->buffer, '"'))
        return yaml_parser_fetch_flow_scalar(parser, 0);

    /*
     * Is it a plain scalar?
     *
     * A plain scalar may start with any non-blank characters except
     *
     *      '-', '?', ':', ',', '[', ']', '{', '}',
     *      '#', '&', '*', '!', '|', '>', '\'', '\"',
     *      '%', '@', '`'.
     *
     * In the block context (and, for the '-' indicator, in the flow context
     * too), it may also start with the characters
     *
     *      '-', '?', ':'
     *
     * if it is followed by a non-space character.
     *
     * The last rule is more restrictive than the specification requires.
     */

    if (!(IS_BLANKZ(parser->buffer) || CHECK(parser->buffer, '-')
                || CHECK(parser->buffer, '?') || CHECK(parser->buffer, ':')
                || CHECK(parser->buffer, ',') || CHECK(parser->buffer, '[')
                || CHECK(parser->buffer, ']') || CHECK(parser->buffer, '{')
                || CHECK(parser->buffer, '}') || CHECK(parser->buffer, '#')
                || CHECK(parser->buffer, '&') || CHECK(parser->buffer, '*')
                || CHECK(parser->buffer, '!') || CHECK(parser->buffer, '|')
                || CHECK(parser->buffer, '>') || CHECK(parser->buffer, '\'')
                || CHECK(parser->buffer, '"') || CHECK(parser->buffer, '%')
                || CHECK(parser->buffer, '@') || CHECK(parser->buffer, '`')) ||
            (CHECK(parser->buffer, '-') && !IS_BLANK_AT(parser->buffer, 1)) ||
            (!parser->flow_level &&
             (CHECK(parser->buffer, '?') || CHECK(parser->buffer, ':'))
             && !IS_BLANKZ_AT(parser->buffer, 1)))
        return yaml_parser_fetch_plain_scalar(parser);

    /*
     * If we don't determine the token type so far, it is an error.
     */

    return yaml_parser_set_scanner_error(parser,
            "while scanning for the next token", parser->mark,
            "found character that cannot start any token");
}